

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::IsPartOf_PDU::Encode(IsPartOf_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  (*(this->m_RelRec).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RelRec,stream);
  (*(this->m_LocPrt).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_LocPrt,stream);
  (*(this->m_NmLocID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_NmLocID,stream);
  (*(this->m_PrtTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_PrtTyp,stream);
  return;
}

Assistant:

void IsPartOf_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << KDIS_STREAM m_RelRec
           << KDIS_STREAM m_LocPrt
           << KDIS_STREAM m_NmLocID
           << KDIS_STREAM m_PrtTyp;
}